

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerTriangles.cpp
# Opt level: O2

RGB __thiscall
RayTracerTriangles::processPixelOnTriangle
          (RayTracerTriangles *this,Point *rayBeg,Point *pointOnTriangle,Triangle *triangle,
          int recursionLevel)

{
  bool bVar1;
  RGB RVar2;
  RGB reflectedColor;
  undefined1 local_68 [8];
  Segment refl;
  
  bVar1 = pointInShadow(this,pointOnTriangle,triangle);
  RVar2 = colorOfPoint(pointOnTriangle,triangle);
  if (bVar1) {
    RVar2 = operator*(RVar2,(this->super_RayTracerBase).config.super_BaseConfig.ambientCoefficient);
  }
  else {
    RVar2 = calculateColorInLight(this,pointOnTriangle,triangle,RVar2);
  }
  if ((recursionLevel < (this->super_RayTracerBase).config.super_BaseConfig.maxRecursionLevel) &&
     (1.1920929e-07 <= ABS(triangle->reflectionCoefficient))) {
    refl.b.y = rayBeg->x;
    refl.b.z = rayBeg->y;
    randomReflection((Segment *)local_68,(Segment *)&refl.b.y,triangle);
    reflectedColor = processPixel(this,(Segment *)local_68,recursionLevel + 1);
    RVar2 = calculateColorFromReflection(RVar2,reflectedColor,triangle->reflectionCoefficient);
  }
  return RVar2;
}

Assistant:

RGB RayTracerTriangles::processPixelOnTriangle(Point const& rayBeg, Point const& pointOnTriangle,
                                               Triangle const& triangle, int recursionLevel)
{
  bool const isInShadow = pointInShadow(pointOnTriangle, triangle);
  RGB color = colorOfPoint(pointOnTriangle, triangle);

  RGB resultCol;
  if (isInShadow)
    resultCol = color * config.ambientCoefficient;
  else
    resultCol = calculateColorInLight(pointOnTriangle, triangle, color);

  if (recursionLevel >= config.maxRecursionLevel || isCloseToZero(triangle.reflectionCoefficient))
    return resultCol;

  Segment refl = randomReflection({rayBeg, pointOnTriangle}, triangle);
  RGB reflectedColor = processPixel(refl, recursionLevel + 1);

  return calculateColorFromReflection(resultCol, reflectedColor, triangle.reflectionCoefficient);
}